

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

int Ssw_ClassesPrepareRehash(Ssw_Cla_t *p,Vec_Ptr_t *vCands,int fConstCorr)

{
  int *piVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Man_t *pAVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *__ptr;
  void *__ptr_00;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  Aig_Obj_t *pAVar15;
  Aig_Obj_t **ppAVar16;
  uint uVar17;
  uint local_40;
  
  iVar6 = vCands->nSize;
  uVar7 = iVar6 / 2 - 1;
  while( true ) {
    do {
      uVar17 = uVar7 + 1;
      uVar5 = uVar7 & 1;
      uVar7 = uVar17;
    } while (uVar5 != 0);
    if (uVar17 < 9) break;
    iVar8 = 5;
    while (uVar17 % (iVar8 - 2U) != 0) {
      uVar5 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar17 < uVar5) goto LAB_0092308c;
    }
  }
LAB_0092308c:
  __ptr = calloc((long)(int)uVar17,8);
  __ptr_00 = calloc((long)p->pAig->vObjs->nSize,8);
  p->nCands1 = 0;
  if (0 < iVar6) {
    lVar11 = 0;
    local_40 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)vCands->pArray[lVar11];
      if (p->pClassSizes[pAVar2->Id] != 0) {
        __assert_fail("p->pClassSizes[pObj->Id] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                      ,0x205,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
      }
      ppAVar3 = p->pAig->pReprs;
      if (ppAVar3 == (Aig_Obj_t **)0x0) {
LAB_0092334b:
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      ppAVar3[pAVar2->Id] = (Aig_Obj_t *)0x0;
      iVar6 = (*p->pFuncNodeIsConst)(p->pManData,pAVar2);
      if (iVar6 == 0) {
        if (fConstCorr == 0) {
          uVar7 = (*p->pFuncNodeHash)(p->pManData,pAVar2);
          pAVar15 = *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar7 % uVar17) * 8);
          if (pAVar15 == (Aig_Obj_t *)0x0) {
            *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar7 % uVar17) * 8) = pAVar2;
          }
          else {
            ppAVar3 = p->pAig->pReprs;
            if (ppAVar3 == (Aig_Obj_t **)0x0) goto LAB_0092334b;
            lVar10 = (long)pAVar2->Id;
            ppAVar3[lVar10] = pAVar15;
            lVar9 = (long)pAVar15->Id;
            lVar14 = *(long *)((long)__ptr_00 + lVar9 * 8);
            piVar12 = p->pClassSizes;
            if (lVar14 == 0) {
              piVar1 = piVar12 + lVar9;
              *piVar1 = *piVar1 + 1;
              local_40 = local_40 + 1;
              lVar9 = (long)pAVar15->Id;
              lVar14 = *(long *)((long)__ptr_00 + lVar9 * 8);
              lVar10 = (long)pAVar2->Id;
            }
            *(long *)((long)__ptr_00 + lVar10 * 8) = lVar14;
            *(Aig_Obj_t **)((long)__ptr_00 + lVar9 * 8) = pAVar2;
            piVar12 = piVar12 + lVar9;
            *piVar12 = *piVar12 + 1;
            local_40 = local_40 + 1;
          }
        }
      }
      else {
        pAVar4 = p->pAig;
        ppAVar3 = pAVar4->pReprs;
        if (ppAVar3 == (Aig_Obj_t **)0x0) {
          if (pAVar4->pConst1 != (Aig_Obj_t *)0x0) goto LAB_0092334b;
LAB_0092332c:
          __assert_fail("!Ssw_ObjIsConst1Cand( pAig, pObj )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswInt.h"
                        ,0xb2,"void Ssw_ObjSetConst1Cand(Aig_Man_t *, Aig_Obj_t *)");
        }
        if (ppAVar3[pAVar2->Id] == pAVar4->pConst1) goto LAB_0092332c;
        ppAVar3[pAVar2->Id] = pAVar4->pConst1;
        p->nCands1 = p->nCands1 + 1;
      }
      lVar11 = lVar11 + 1;
      uVar13 = (ulong)vCands->nSize;
    } while (lVar11 < (long)uVar13);
    if (vCands->nSize < 1) {
      uVar7 = 0;
    }
    else {
      piVar12 = p->pClassSizes;
      lVar11 = 0;
      uVar7 = 0;
      do {
        pAVar2 = (Aig_Obj_t *)vCands->pArray[lVar11];
        lVar14 = (long)pAVar2->Id;
        uVar5 = piVar12[lVar14];
        if ((ulong)uVar5 != 0) {
          if ((int)uVar5 < 2) {
            __assert_fail("nNodes > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                          ,0x232,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
          }
          ppAVar3 = p->pMemClassesFree;
          ppAVar3[uVar7] = pAVar2;
          pAVar15 = *(Aig_Obj_t **)((long)__ptr_00 + lVar14 * 8);
          if (pAVar15 != (Aig_Obj_t *)0x0) {
            ppAVar16 = ppAVar3 + (ulong)uVar7 + (ulong)uVar5;
            do {
              ppAVar16 = ppAVar16 + -1;
              *ppAVar16 = pAVar15;
              pAVar15 = *(Aig_Obj_t **)((long)__ptr_00 + (long)pAVar15->Id * 8);
            } while (pAVar15 != (Aig_Obj_t *)0x0);
          }
          p->pClassSizes[lVar14] = 0;
          iVar6 = pAVar2->Id;
          if (p->pId2Class[iVar6] != (Aig_Obj_t **)0x0) {
            __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                          ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          if (ppAVar3[uVar7] != pAVar2) {
            __assert_fail("pClass[0] == pRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                          ,0x5f,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          p->pId2Class[iVar6] = ppAVar3 + uVar7;
          piVar12 = p->pClassSizes;
          if (piVar12[iVar6] != 0) {
            __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                          ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          piVar12[iVar6] = uVar5;
          p->nClasses = p->nClasses + 1;
          p->nLits = p->nLits + uVar5 + -1;
          uVar7 = uVar7 + uVar5;
          uVar13 = (ulong)(uint)vCands->nSize;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)uVar13);
    }
    p->pMemClassesFree = p->pMemClassesFree + uVar7;
    if (local_40 != uVar7) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                    ,0x242,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  iVar6 = Ssw_ClassesRefine(p,1);
  return iVar6;
}

Assistant:

int Ssw_ClassesPrepareRehash( Ssw_Cla_t * p, Vec_Ptr_t * vCands, int fConstCorr )
{
//    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Vec_PtrSize(vCands)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );

    // sort through the candidates
    nEntries = 0;
    p->nCands1 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        assert( p->pClassSizes[pObj->Id] == 0 );
        Aig_ObjSetRepr( p->pAig, pObj, NULL );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Ssw_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        if ( fConstCorr )
            continue;
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
        }
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Ssw_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Ssw_ObjSetNext( ppNexts, pObj, Ssw_ObjNext( ppNexts, pRepr ) );
            Ssw_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClassesFree + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Ssw_ObjNext(ppNexts, pObj), k = 1; pTemp;
              pTemp = Ssw_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Ssw_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    p->pMemClassesFree += nEntries2;
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    return Ssw_ClassesRefine( p, 1 );
}